

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

void vkt::anon_unknown_0::genUniformBlock
               (ostringstream *out,string *blockName,string *instanceName,int setNdx,int bindingNdx,
               vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *uniforms)

{
  bool bVar1;
  ostream *poVar2;
  pointer varType;
  pointer pVVar3;
  ulong uVar4;
  DeclareVariable local_80;
  __normal_iterator<const_glu::sl::Value_*,_std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>_>
  local_40;
  __normal_iterator<const_glu::sl::Value_*,_std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>_>
  local_38;
  const_iterator val;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *uniforms_local;
  int bindingNdx_local;
  int setNdx_local;
  string *instanceName_local;
  string *blockName_local;
  ostringstream *out_local;
  
  val._M_current = (Value *)uniforms;
  std::operator<<((ostream *)out,"layout(");
  if (setNdx != 0) {
    poVar2 = std::operator<<((ostream *)out,"set = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,setNdx);
    std::operator<<(poVar2,", ");
  }
  poVar2 = std::operator<<((ostream *)out,"binding = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bindingNdx);
  poVar2 = std::operator<<(poVar2,", std140) uniform ");
  poVar2 = std::operator<<(poVar2,(string *)blockName);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"{\n");
  local_38._M_current =
       (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::begin(val._M_current);
  while( true ) {
    local_40._M_current =
         (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::end(val._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)out,"\t");
    varType = __gnu_cxx::
              __normal_iterator<const_glu::sl::Value_*,_std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>_>
              ::operator->(&local_38);
    pVVar3 = __gnu_cxx::
             __normal_iterator<const_glu::sl::Value_*,_std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>_>
             ::operator->(&local_38);
    glu::declare(&local_80,&varType->type,&pVVar3->name,1);
    poVar2 = glu::decl::operator<<(poVar2,&local_80);
    std::operator<<(poVar2,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_80);
    __gnu_cxx::
    __normal_iterator<const_glu::sl::Value_*,_std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>_>
    ::operator++(&local_38);
  }
  std::operator<<((ostream *)out,"}");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)out," ");
    std::operator<<(poVar2,(string *)instanceName);
  }
  std::operator<<((ostream *)out,";\n");
  return;
}

Assistant:

void genUniformBlock (ostringstream& out, const string& blockName, const string& instanceName, int setNdx, int bindingNdx, const vector<Value>& uniforms)
{
	out << "layout(";

	if (setNdx != 0)
		out << "set = " << setNdx << ", ";

	out << "binding = " << bindingNdx << ", std140) uniform " << blockName << "\n"
		<< "{\n";

	for (vector<Value>::const_iterator val = uniforms.begin(); val != uniforms.end(); ++val)
		out << "\t" << glu::declare(val->type, val->name, 1) << ";\n";

	out << "}";

	if (!instanceName.empty())
		out << " " << instanceName;

	out << ";\n";
}